

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O2

SubprocessResult *
phosg::run_process(SubprocessResult *__return_storage_ptr__,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *cmd,string *stdin_data,bool check,string *cwd,
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *env,size_t timeout_usecs)

{
  int iVar1;
  __node_base _Var2;
  size_type sVar3;
  size_type sVar4;
  bool bVar5;
  __pid_t _Var6;
  uint uVar7;
  __node_base *p_Var8;
  __node_ptr p_Var9;
  _Hashtable<int,_std::pair<const_int,_Buffer>,_std::allocator<std::pair<const_int,_Buffer>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this;
  __buckets_ptr *ppp_Var10;
  mapped_type *ppbVar11;
  ssize_t sVar12;
  _Hashtable<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  size_type sVar13;
  uint *puVar14;
  uint64_t uVar15;
  runtime_error *this_01;
  __node_base_ptr p_Var16;
  SubprocessResult *__c;
  SubprocessResult *__k;
  int __sig;
  ulong uVar17;
  ulong uVar18;
  __node_base *p_Var19;
  ulong uVar20;
  _Hashtable<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var21;
  size_t sVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [12];
  Subprocess sp;
  Poll p;
  unordered_map<int,_Buffer,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Buffer>_>_>
  write_fd_to_buffer;
  uint64_t local_e8;
  __buckets_alloc_type __alloc;
  _Hashtable<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_c0;
  string local_88;
  unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  read_fd_to_buffer;
  
  SubprocessResult::SubprocessResult(__return_storage_ptr__);
  local_e8 = now();
  Subprocess::Subprocess(&sp,cmd,-1,-1,-1,cwd,env);
  make_fd_nonblocking(sp.stdin_write_fd);
  make_fd_nonblocking(sp.stdout_read_fd);
  make_fd_nonblocking(sp.stderr_read_fd);
  iVar1 = sp.stdin_write_fd;
  this = (_Hashtable<int,_std::pair<const_int,_Buffer>,_std::allocator<std::pair<const_int,_Buffer>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          *)&write_fd_to_buffer._M_h._M_single_bucket;
  write_fd_to_buffer._M_h._M_bucket_count = 1;
  write_fd_to_buffer._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  write_fd_to_buffer._M_h._M_element_count = 0;
  write_fd_to_buffer._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  write_fd_to_buffer._M_h._M_rehash_policy._M_next_resize = 0;
  write_fd_to_buffer._M_h._M_single_bucket = (__node_base_ptr)0x0;
  read_fd_to_buffer._M_h._M_buckets = &read_fd_to_buffer._M_h._M_single_bucket;
  read_fd_to_buffer._M_h._M_bucket_count = 1;
  read_fd_to_buffer._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  read_fd_to_buffer._M_h._M_element_count = 0;
  read_fd_to_buffer._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  p.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  read_fd_to_buffer._M_h._M_rehash_policy._M_next_resize = 0;
  read_fd_to_buffer._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  p.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  write_fd_to_buffer._M_h._M_buckets = (__buckets_ptr)this;
  if (stdin_data == (string *)0x0) {
    close(sp.stdin_write_fd);
    goto LAB_00112920;
  }
  local_c0._M_buckets = (__buckets_ptr)&write_fd_to_buffer;
  p_Var8 = (__node_base *)operator_new(0x20);
  sVar4 = write_fd_to_buffer._M_h._M_bucket_count;
  p_Var8->_M_nxt = (_Hash_node_base *)0x0;
  uVar20 = (ulong)iVar1;
  *(int *)(p_Var8 + 1) = iVar1;
  *(string **)(p_Var8 + 2) = stdin_data;
  p_Var8[3] = (_Hash_node_base *)0x0;
  uVar17 = uVar20 % write_fd_to_buffer._M_h._M_bucket_count;
  local_c0._M_bucket_count = (size_type)p_Var8;
  p_Var9 = ::std::
           _Hashtable<int,_std::pair<const_int,_Buffer>,_std::allocator<std::pair<const_int,_Buffer>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_node(&write_fd_to_buffer._M_h,uVar17,(key_type *)(p_Var8 + 1),
                          (__hash_code)(p_Var8 + 1));
  if (p_Var9 != (__node_ptr)0x0) goto LAB_00112902;
  auVar23 = ::std::__detail::_Prime_rehash_policy::_M_need_rehash
                      ((ulong)&write_fd_to_buffer._M_h._M_rehash_policy,sVar4,
                       write_fd_to_buffer._M_h._M_element_count);
  __k = auVar23._8_8_;
  p_Var21 = (_Hashtable<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)&write_fd_to_buffer._M_h._M_before_begin;
  if ((auVar23 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_001128b2;
  if (__k == (SubprocessResult *)0x1) goto LAB_00112d68;
  this = (_Hashtable<int,_std::pair<const_int,_Buffer>,_std::allocator<std::pair<const_int,_Buffer>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          *)std::allocator_traits<std::allocator<std::__detail::_Hash_node_base_*>_>::allocate
                      ((allocator_type *)&__alloc,(size_type)__k);
  memset(this,0,(long)__k * 8);
  do {
    _Var2._M_nxt = write_fd_to_buffer._M_h._M_before_begin._M_nxt;
    write_fd_to_buffer._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    uVar17 = 0;
LAB_0011282b:
    uVar18 = uVar17;
    p_Var16 = (__node_base_ptr)_Var2._M_nxt;
    if (p_Var16 != (__node_base_ptr)0x0) {
      _Var2._M_nxt = (_Hash_node_base *)p_Var16->_M_nxt;
      uVar17 = (ulong)(long)*(int *)&p_Var16[1]._M_nxt % (ulong)__k;
      if ((&this->_M_buckets)[uVar17] == (__buckets_ptr)0x0) break;
      p_Var16->_M_nxt = *(&this->_M_buckets)[uVar17];
      ppp_Var10 = (__buckets_ptr *)(&this->_M_buckets)[uVar17];
      uVar17 = uVar18;
      goto LAB_00112875;
    }
    ::std::
    _Hashtable<int,_std::pair<const_int,_Buffer>,_std::allocator<std::pair<const_int,_Buffer>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_deallocate_buckets(&write_fd_to_buffer._M_h);
    write_fd_to_buffer._M_h._M_bucket_count = (size_type)__k;
    write_fd_to_buffer._M_h._M_buckets = (__buckets_ptr)this;
    uVar17 = uVar20 % (ulong)__k;
LAB_001128b2:
    if (write_fd_to_buffer._M_h._M_buckets[uVar17] == (__node_base_ptr)0x0) {
      p_Var8->_M_nxt = (_Hash_node_base *)write_fd_to_buffer._M_h._M_before_begin._M_nxt;
      if (write_fd_to_buffer._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        write_fd_to_buffer._M_h._M_buckets
        [(ulong)(long)*(int *)&write_fd_to_buffer._M_h._M_before_begin._M_nxt[1]._M_nxt %
         write_fd_to_buffer._M_h._M_bucket_count] = p_Var8;
      }
      write_fd_to_buffer._M_h._M_buckets[uVar17] = (__node_base_ptr)p_Var21;
      write_fd_to_buffer._M_h._M_before_begin._M_nxt = (_Hash_node_base *)p_Var8;
    }
    else {
      p_Var8->_M_nxt = write_fd_to_buffer._M_h._M_buckets[uVar17]->_M_nxt;
      write_fd_to_buffer._M_h._M_buckets[uVar17]->_M_nxt = p_Var8;
    }
    write_fd_to_buffer._M_h._M_element_count = write_fd_to_buffer._M_h._M_element_count + 1;
    local_c0._M_bucket_count = 0;
LAB_00112902:
    ::std::
    _Hashtable<int,_std::pair<const_int,_Buffer>,_std::allocator<std::pair<const_int,_Buffer>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_Scoped_node::~_Scoped_node((_Scoped_node *)&local_c0);
    Poll::add(&p,sp.stdin_write_fd,4);
LAB_00112920:
    ___alloc = sp.stdout_read_fd;
    local_c0._M_buckets = (__buckets_ptr)__return_storage_ptr__;
    ::std::
    _Hashtable<int,std::pair<int_const,std::__cxx11::string*>,std::allocator<std::pair<int_const,std::__cxx11::string*>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<int,std::__cxx11::string*>
              ((_Hashtable<int,std::pair<int_const,std::__cxx11::string*>,std::allocator<std::pair<int_const,std::__cxx11::string*>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&read_fd_to_buffer);
    Poll::add(&p,sp.stdout_read_fd,1);
    ___alloc = sp.stderr_read_fd;
    local_c0._M_buckets = (__buckets_ptr)&__return_storage_ptr__->stderr_contents;
    ::std::
    _Hashtable<int,std::pair<int_const,std::__cxx11::string*>,std::allocator<std::pair<int_const,std::__cxx11::string*>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<int,std::__cxx11::string*>
              ((_Hashtable<int,std::pair<int_const,std::__cxx11::string*>,std::allocator<std::pair<int_const,std::__cxx11::string*>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&read_fd_to_buffer);
    Poll::add(&p,sp.stderr_read_fd,1);
    p_Var19 = &read_fd_to_buffer._M_h._M_before_begin;
    bVar5 = false;
    this = &write_fd_to_buffer._M_h;
    sVar22 = timeout_usecs;
LAB_001129c7:
    _Var6 = Subprocess::wait(&sp,(void *)0x1);
    __return_storage_ptr__->exit_status = _Var6;
    if (_Var6 != -1) {
      uVar15 = now();
      __return_storage_ptr__->elapsed_time = uVar15 - __return_storage_ptr__->elapsed_time;
      do {
        while( true ) {
          p_Var19 = p_Var19->_M_nxt;
          if (p_Var19 == (__node_base *)0x0) {
            if ((check) && (_Var6 = Subprocess::wait(&sp,(void *)0x0), _Var6 != 0)) {
              this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
              uVar7 = Subprocess::wait(&sp,(void *)0x0);
              string_printf_abi_cxx11_
                        ((string *)&local_c0,"command returned code %d\nstdout:\n%s\nstderr:\n%s",
                         (ulong)uVar7,(__return_storage_ptr__->stdout_contents)._M_dataplus._M_p,
                         (__return_storage_ptr__->stderr_contents)._M_dataplus._M_p);
              ::std::runtime_error::runtime_error(this_01,(string *)&local_c0);
              __cxa_throw(this_01,&::std::runtime_error::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
            ::std::_Vector_base<pollfd,_std::allocator<pollfd>_>::~_Vector_base
                      ((_Vector_base<pollfd,_std::allocator<pollfd>_> *)&p);
            ::std::
            _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::~_Hashtable(&read_fd_to_buffer._M_h);
            ::std::
            unordered_map<int,_Buffer,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Buffer>_>_>
            ::~unordered_map(&write_fd_to_buffer);
            Subprocess::~Subprocess(&sp);
            return __return_storage_ptr__;
          }
          while( true ) {
            sVar3 = (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      &((_Prime_rehash_policy *)(p_Var19 + 2))->_M_max_load_factor)->
                    _M_string_length;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                      (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        &((_Prime_rehash_policy *)(p_Var19 + 2))->_M_max_load_factor,sVar3 + 0x20000
                      );
            sVar12 = ::read((int)*(size_type *)(p_Var19 + 1),
                            (void *)((long)&(*(_Hash_node_base **)
                                              &((_Prime_rehash_policy *)(p_Var19 + 2))->
                                               _M_max_load_factor)->_M_nxt->_M_nxt + sVar3),0x20000)
            ;
            if (sVar12 < 1) break;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                      (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        &((_Prime_rehash_policy *)(p_Var19 + 2))->_M_max_load_factor,
                       (sVar12 + (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    **)&((_Prime_rehash_policy *)(p_Var19 + 2))->_M_max_load_factor)
                                 ->_M_string_length) - 0x20000);
          }
          if (sVar12 < 0) break;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                    (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      &((_Prime_rehash_policy *)(p_Var19 + 2))->_M_max_load_factor,sVar3);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                  (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    &((_Prime_rehash_policy *)(p_Var19 + 2))->_M_max_load_factor,sVar3);
        puVar14 = (uint *)__errno_location();
      } while ((*puVar14 == 4) || (*puVar14 == 0xb));
      auVar24 = __cxa_allocate_exception(0x10);
      string_for_error_abi_cxx11_((string *)&__alloc,(phosg *)(ulong)*puVar14,auVar24._8_4_);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_c0,"read failed: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__alloc
                      );
      ::std::runtime_error::runtime_error(auVar24._0_8_,(string *)&local_c0);
      __cxa_throw(auVar24._0_8_,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    __c = __return_storage_ptr__;
    Poll::poll((Poll *)&local_c0,(pollfd *)&p,1000,(int)__return_storage_ptr__);
    p_Var8 = &local_c0._M_before_begin;
    this_00 = &local_c0;
LAB_001129ff:
    p_Var8 = p_Var8->_M_nxt;
    if (p_Var8 == (__node_base *)0x0) goto LAB_00112b7c;
    __k = (SubprocessResult *)(p_Var8 + 1);
    p_Var21 = this_00;
    if ((*(size_type *)(p_Var8 + 1) & 0x100000000) != 0) {
      ppbVar11 = ::std::__detail::
                 _Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&read_fd_to_buffer,(key_type *)__k);
      this_00 = (_Hashtable<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)*ppbVar11;
      sVar3 = this_00->_M_bucket_count;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 sVar3 + 0x20000);
      sVar12 = ::read(*(int *)&(__k->stdout_contents)._M_dataplus._M_p,
                      ((_Alloc_hider *)&this_00->_M_buckets)->_M_p + sVar3,0x20000);
      p_Var21 = this_00;
      if (0 < sVar12) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   sVar12 + sVar3);
        goto LAB_00112a9c;
      }
      if (-1 < sVar12) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   sVar3);
        Poll::remove(&p,(char *)(ulong)*(uint *)&(__k->stdout_contents)._M_dataplus._M_p);
        ::std::
        _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::_M_erase(&read_fd_to_buffer._M_h,__k);
        goto LAB_00112a9c;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,sVar3)
      ;
      puVar14 = (uint *)__errno_location();
      if ((*puVar14 != 4) && (*puVar14 != 0xb)) {
        auVar24 = __cxa_allocate_exception(0x10);
        string_for_error_abi_cxx11_(&local_88,(phosg *)(ulong)*puVar14,auVar24._8_4_);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__alloc,"read failed: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_88);
        ::std::runtime_error::runtime_error(auVar24._0_8_,(string *)&__alloc);
        __cxa_throw(auVar24._0_8_,&::std::runtime_error::typeinfo,
                    ::std::runtime_error::~runtime_error);
      }
      goto LAB_001129ff;
    }
LAB_00112a9c:
    this_00 = p_Var21;
    if ((*(size_type *)(p_Var8 + 1) & 0x400000000) == 0) goto LAB_001129ff;
    iVar1 = *(int *)&(__k->stdout_contents)._M_dataplus._M_p;
    uVar20 = (ulong)iVar1;
    this_00 = (_Hashtable<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)::std::
                 _Hashtable<int,_std::pair<const_int,_Buffer>,_std::allocator<std::pair<const_int,_Buffer>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::_M_find_node(this,uVar20 % write_fd_to_buffer._M_h._M_bucket_count,
                                (key_type *)__k,(__hash_code)__c);
    if (this_00 !=
        (_Hashtable<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         *)0x0) {
      sVar12 = write(iVar1,(void *)(this_00->_M_element_count +
                                   *(long *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                              *)&this_00->_M_before_begin)->_M_allocated_capacity),
                     ((long *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)&this_00->_M_before_begin)->_M_allocated_capacity)[1] -
                     this_00->_M_element_count);
      if (sVar12 < 1) {
        __c = __k;
        if (sVar12 < 0) {
          puVar14 = (uint *)__errno_location();
          __c = __k;
          if ((*puVar14 != 4) && (*puVar14 != 0xb)) {
            auVar24 = __cxa_allocate_exception(0x10);
            string_for_error_abi_cxx11_(&local_88,(phosg *)(ulong)*puVar14,auVar24._8_4_);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &__alloc,"write failed: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_88);
            ::std::runtime_error::runtime_error(auVar24._0_8_,(string *)&__alloc);
            __cxa_throw(auVar24._0_8_,&::std::runtime_error::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          goto LAB_001129ff;
        }
      }
      else {
        sVar13 = sVar12 + this_00->_M_element_count;
        this_00->_M_element_count = sVar13;
        __c = (SubprocessResult *)&sp;
        if (sVar13 != *(size_type *)
                       (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)&this_00->_M_before_begin)->_M_allocated_capacity + 8))
        goto LAB_001129ff;
      }
      Poll::remove(&p,(char *)(ulong)*(uint *)&(__c->stdout_contents)._M_dataplus._M_p);
      ::std::
      unordered_map<int,_Buffer,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Buffer>_>_>
      ::erase((unordered_map<int,_Buffer,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Buffer>_>_>
               *)this,(key_type *)__k);
      goto LAB_001129ff;
    }
    ::std::__throw_out_of_range("_Map_base::at");
LAB_00112d68:
    write_fd_to_buffer._M_h._M_single_bucket = (__node_base_ptr)0x0;
  } while( true );
  p_Var16->_M_nxt = (_Hash_node_base *)write_fd_to_buffer._M_h._M_before_begin._M_nxt;
  write_fd_to_buffer._M_h._M_before_begin._M_nxt = (_Hash_node_base *)p_Var16;
  (&this->_M_buckets)[uVar17] = (__buckets_ptr)p_Var21;
  if (p_Var16->_M_nxt != (_Hash_node_base *)0x0) {
    ppp_Var10 = &this->_M_buckets + uVar18;
LAB_00112875:
    *ppp_Var10 = &p_Var16->_M_nxt;
  }
  goto LAB_0011282b;
LAB_00112b7c:
  std::
  _Hashtable<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_c0);
  if (sVar22 == 0) {
    sVar22 = 0;
  }
  else {
    uVar15 = now();
    if (local_e8 < uVar15 - sVar22) {
      if (bVar5) {
        bVar5 = true;
        Subprocess::kill(&sp,9,__sig);
      }
      else {
        Subprocess::kill(&sp,0xf,__sig);
        sVar22 = 5000000;
        bVar5 = true;
        local_e8 = now();
      }
    }
  }
  goto LAB_001129c7;
}

Assistant:

SubprocessResult run_process(const vector<string>& cmd, const string* stdin_data,
    bool check, const std::string* cwd,
    const std::unordered_map<std::string, std::string>* env,
    size_t timeout_usecs) {
  SubprocessResult ret;
  bool terminated = false;
  uint64_t start_time = now();

  Subprocess sp(cmd, -1, -1, -1, cwd, env);

  make_fd_nonblocking(sp.stdin_fd());
  make_fd_nonblocking(sp.stdout_fd());
  make_fd_nonblocking(sp.stderr_fd());

  struct Buffer {
    const string* buf;
    size_t offset;
    Buffer(const string* buf) : buf(buf), offset(0) {}
  };
  unordered_map<int, Buffer> write_fd_to_buffer;
  unordered_map<int, string*> read_fd_to_buffer;

  Poll p;
  if (stdin_data) {
    write_fd_to_buffer.emplace(sp.stdin_fd(), stdin_data);
    p.add(sp.stdin_fd(), POLLOUT);
  } else {
    close(sp.stdin_fd());
  }
  read_fd_to_buffer.emplace(sp.stdout_fd(), &ret.stdout_contents);
  p.add(sp.stdout_fd(), POLLIN);
  read_fd_to_buffer.emplace(sp.stderr_fd(), &ret.stderr_contents);
  p.add(sp.stderr_fd(), POLLIN);

  // Read and write to pipes as long as the process is running
  while ((ret.exit_status = sp.wait(true)) == -1) {
    for (const auto& pfd : p.poll(1000)) {
      if (pfd.second & POLLIN) {
        string* buf = read_fd_to_buffer.at(pfd.first);
        size_t read_offset = buf->size();
        buf->resize(read_offset + READ_BLOCK_SIZE);
        ssize_t bytes_read = ::read(pfd.first, buf->data() + read_offset, READ_BLOCK_SIZE);
        if (bytes_read > 0) {
          buf->resize(read_offset + bytes_read);
        } else if (bytes_read < 0) {
          buf->resize(read_offset);
          if (errno == EAGAIN || errno == EINTR || errno == EWOULDBLOCK) {
            continue;
          }
          throw runtime_error("read failed: " + string_for_error(errno));
        } else { // bytes_read == 0; usually means the pipe is broken
          buf->resize(read_offset);
          p.remove(pfd.first, true);
          read_fd_to_buffer.erase(pfd.first);
        }
      }
      if (pfd.second & POLLOUT) {
        auto& buf = write_fd_to_buffer.at(pfd.first);
        size_t bytes_to_write = buf.buf->size() - buf.offset;
        ssize_t bytes_written = write(pfd.first,
            buf.buf->data() + buf.offset, bytes_to_write);
        if (bytes_written > 0) {
          buf.offset += bytes_written;
          if (buf.offset == buf.buf->size()) {
            p.remove(sp.stdin_fd(), true);
            write_fd_to_buffer.erase(pfd.first);
          }
        } else if (bytes_written < 0) {
          if (errno == EAGAIN || errno == EINTR || errno == EWOULDBLOCK) {
            continue;
          }
          throw runtime_error("write failed: " + string_for_error(errno));
        } else { // bytes_written == 0; usually means the pipe is broken
          p.remove(pfd.first, true);
          write_fd_to_buffer.erase(pfd.first);
        }
      }
    }

    if (timeout_usecs && (start_time < now() - timeout_usecs)) {
      if (!terminated) {
        sp.kill(SIGTERM);
        terminated = true;
        timeout_usecs = 5000000;
        start_time = now();
      } else {
        sp.kill(SIGKILL);
      }
    }
  }
  ret.elapsed_time = now() - ret.elapsed_time;

  // Read any leftover data after termination
  for (auto& it : read_fd_to_buffer) {
    for (;;) {
      size_t read_offset = it.second->size();
      it.second->resize(read_offset + READ_BLOCK_SIZE);
      ssize_t bytes_read = ::read(it.first, it.second->data() + read_offset, READ_BLOCK_SIZE);
      if (bytes_read > 0) {
        it.second->resize(it.second->size() - READ_BLOCK_SIZE + bytes_read);
      } else if (bytes_read < 0) {
        it.second->resize(read_offset);
        if (errno == EAGAIN || errno == EINTR || errno == EWOULDBLOCK) {
          break;
        }
        throw runtime_error("read failed: " + string_for_error(errno));
      } else { // bytes_read == 0; usually means the pipe is broken
        it.second->resize(read_offset);
        break;
      }
    }
  }

  if (check && sp.wait()) {
    throw runtime_error(string_printf("command returned code %d\nstdout:\n%s\nstderr:\n%s",
        sp.wait(), ret.stdout_contents.c_str(), ret.stderr_contents.c_str()));
  }

  return ret;
}